

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall sglr::rc::Texture1D::updateView(Texture1D *this,DepthStencilMode mode)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ConstPixelBufferAccess *pCVar5;
  int iVar6;
  
  uVar2 = (this->super_Texture).m_baseLevel;
  uVar3 = (ulong)uVar2;
  if ((uVar3 < 0xe) && ((this->m_levels).m_data[uVar3].m_cap != 0)) {
    uVar1 = (this->m_levels).m_access[uVar3].super_ConstPixelBufferAccess.m_size.m_data[0];
    iVar6 = 0;
    if (uVar1 != 0) {
      pCVar5 = (ConstPixelBufferAccess *)0x0;
      if ((this->m_levels).m_access[uVar3].super_ConstPixelBufferAccess.m_size.m_data[1] == 0)
      goto LAB_004df947;
      if ((this->m_levels).m_access[uVar3].super_ConstPixelBufferAccess.m_size.m_data[2] != 0) {
        iVar6 = 1;
        if (LINEAR < (this->super_Texture).m_sampler.minFilter) {
          iVar4 = ((this->super_Texture).m_maxLevel - uVar2) + 1;
          uVar2 = 0x20;
          if (uVar1 != 0) {
            uVar2 = 0x1f;
            if (uVar1 != 0) {
              for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
              }
            }
            uVar2 = uVar2 ^ 0x1f;
          }
          iVar6 = 0x20 - uVar2;
          if (iVar4 < (int)(0x20 - uVar2)) {
            iVar6 = iVar4;
          }
        }
        TextureLevelArray::updateSamplerMode(&this->m_levels,mode);
        pCVar5 = (this->m_levels).m_effectiveAccess + uVar3;
        goto LAB_004df947;
      }
    }
  }
  iVar6 = 0;
  pCVar5 = (ConstPixelBufferAccess *)0x0;
LAB_004df947:
  (this->m_view).m_numLevels = iVar6;
  (this->m_view).m_levels = pCVar5;
  return;
}

Assistant:

void Texture1D::updateView (tcu::Sampler::DepthStencilMode mode)
{
	const int baseLevel	= getBaseLevel();

	if (hasLevel(baseLevel) && !isEmpty(getLevel(baseLevel)))
	{
		const int	width		= getLevel(baseLevel).getWidth();
		const bool	isMipmap	= isMipmapFilter(getSampler().minFilter);
		const int	numLevels	= isMipmap ? de::min(getMaxLevel()-baseLevel+1, getNumMipLevels1D(width)) : 1;

		m_levels.updateSamplerMode(mode);
		m_view = tcu::Texture2DView(numLevels, m_levels.getEffectiveLevels() + baseLevel);
	}
	else
		m_view = tcu::Texture2DView(0, DE_NULL);
}